

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

bool __thiscall progress::update(progress *this,uint64_t delta,bool force)

{
  ostringstream *os;
  ostringstream *poVar1;
  long lVar2;
  undefined1 uVar3;
  time_duration_type tVar4;
  ostream *poVar5;
  progress *ppVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  float fVar10;
  ptime now;
  float local_4c;
  string local_48;
  float local_24;
  
  if (show_progress) {
    uVar9 = delta + this->value;
    bVar8 = progress_cleared ^ 1 | force;
    this->value = uVar9;
    uVar7 = this->max;
    if (uVar7 == 0) {
      local_4c = 0.0;
    }
    else {
      ppVar6 = (progress *)&this->value;
      if (uVar7 < uVar9) {
        ppVar6 = this;
      }
      fVar10 = ((float)ppVar6->max * 1000.0) / (float)uVar7;
      uVar7 = (ulong)fVar10;
      local_4c = (float)((long)(fVar10 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7) * 0.001;
      if (local_4c == this->last_status && (bVar8 & 1) == 0) {
        return false;
      }
    }
    local_48._M_dataplus._M_p =
         (pointer)boost::date_time::microsec_clock<boost::posix_time::ptime>::create_time
                            (boost::date_time::c_time::gmtime);
    tVar4 = boost::date_time::
            counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>
            ::subtract_times((time_rep_type *)&local_48,(time_rep_type *)&this->start_time);
    if (((bVar8 & 1) != 0) ||
       (49999 < (long)tVar4.
                      super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                      .ticks_.value_ - this->last_time)) {
      this->last_time =
           (uint64_t)
           tVar4.
           super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
           .ticks_.value_;
      this->last_status = local_4c;
      if ((this->max == 0) &&
         (local_4c = fmodf((float)(ulong)tVar4.
                                         super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                         .ticks_.value_ * 2e-07,2.0), 1.0 < local_4c)) {
        local_4c = 2.0 - local_4c;
      }
      if (((this->show_rate == true) &&
          (tVar4.
           super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
           .ticks_.value_ != (impl_type)0x0 && 0x27ff < this->value)) &&
         (fVar10 = ((float)this->value * 1e+06) /
                   (float)(ulong)tVar4.
                                 super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                 .ticks_.value_, fVar10 != this->last_rate)) {
        this->last_rate = fVar10;
        local_48._M_string_length = 0;
        local_48.field_2._M_local_buf[0] = '\0';
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        local_24 = fVar10;
        std::__cxx11::stringbuf::str((string *)&this->field_0x40);
        os = &this->label;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,
                          CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                   local_48.field_2._M_local_buf[0]) + 1);
        }
        lVar2 = *(long *)os;
        *(uint *)(&this->field_0x50 + *(long *)(lVar2 + -0x18)) =
             *(uint *)(&this->field_0x50 + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x80;
        *(uint *)(&this->field_0x50 + *(long *)(lVar2 + -0x18)) =
             *(uint *)(&this->field_0x50 + *(long *)(lVar2 + -0x18)) & 0xfffffefb | 4;
        poVar1 = os + *(long *)(lVar2 + -0x18);
        if ((&this->field_0x119)[*(long *)(lVar2 + -0x18)] == '\0') {
          uVar3 = std::ios::widen((char)poVar1);
          poVar1[0xe0] = (ostringstream)uVar3;
          poVar1[0xe1] = (ostringstream)0x1;
        }
        poVar1[0xe0] = (ostringstream)0x20;
        *(undefined8 *)(&this->field_0x48 + *(long *)(*(long *)os + -0x18)) = 5;
        local_48._M_dataplus._M_p = (pointer)((ulong)(uint)local_24 | 0x100000000);
        poVar5 = detail::operator<<((ostream *)os,(print_bytes<float> *)&local_48);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/s",2);
      }
      if (this->max == 0) {
        std::__cxx11::stringbuf::str();
        show_unbounded(local_4c,&local_48);
      }
      else {
        std::__cxx11::stringbuf::str();
        show(local_4c,&local_48);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool progress::update(boost::uint64_t delta, bool force) {
	
	if(!show_progress) {
		return false;
	}
	
	force = force || progress_cleared;
	
	value += delta;
	
	float status = 0.f;
	if(max) {
		status = float(std::min(value, max)) / float(max);
		status = float(size_t(1000.f * status)) * (1.f / 1000.f);
		if(!force && status == last_status) {
			return false;
		}
	}
	
	boost::uint64_t time;
	try {
		boost::posix_time::ptime now(boost::posix_time::microsec_clock::universal_time());
		time = boost::uint64_t((now - start_time).total_microseconds());
	} catch(...) {
		// this shouldn't happen, assume no time has passed
		time = last_time;
	}
	
	#if defined(_WIN32)
	const boost::uint64_t update_interval = 100000;
	#else
	const boost::uint64_t update_interval = 50000;
	#endif
	if(!force && time - last_time < update_interval) {
		return false;
	}
	
	last_time = time;
	last_status = status;
	
	if(!max) {
		status = std::fmod(float(time) * (1.f / 5000000.f), 2.f);
		if(status > 1.f) {
			status = 2.f - status;
		}
	}
	
	if(show_rate) {
		if(value >= 10 * 1024 && time > 0) {
			float rate = 1000000.f * float(value) / float(time);
			if(rate != last_rate) {
				last_rate = rate;
				label.str(std::string()); // clear the buffer
				label << std::right << std::fixed << std::setfill(' ') << std::setw(5)
				      << print_bytes(rate, 1) << "/s";
			}
		}
	}
	
	if(max) {
		show(status, label.str());
	} else {
		show_unbounded(status, label.str());
	}
	
	return true;
}